

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzelchdiv.cpp
# Opt level: O2

void __thiscall
TPZCompElHDiv<pzshape::TPZShapeTriang>::InitMaterialData
          (TPZCompElHDiv<pzshape::TPZShapeTriang> *this,TPZMaterialData *data)

{
  int *piVar1;
  pair<int,_long> *ppVar2;
  uint uVar3;
  TPZGeoEl *this_00;
  TPZGeoNode *pTVar4;
  double *pdVar5;
  int i_2;
  int i;
  long lVar6;
  ulong row;
  int i_1;
  ulong uVar7;
  int local_dc;
  TPZManVector<int,_3> sideorient;
  TPZManVector<long,_3> ids;
  TPZManVector<int,_7> orders;
  
  TPZManVector<long,_3>::TPZManVector(&ids,3);
  sideorient.super_TPZVec<int>._vptr_TPZVec._0_4_ = 0;
  TPZManVector<int,_7>::TPZManVector(&orders,4,(int *)&sideorient);
  local_dc = 0;
  TPZManVector<int,_3>::TPZManVector(&sideorient,3,&local_dc);
  this_00 = TPZCompEl::Reference((TPZCompEl *)this);
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    pTVar4 = TPZGeoEl::NodePtr(this_00,(int)lVar6);
    ids.super_TPZVec<long>.fStore[lVar6] = (long)pTVar4->fId;
  }
  for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
    lVar6 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                   super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                   super_TPZCompEl + 0xa8))(this,uVar7 & 0xffffffff);
    orders.super_TPZVec<int>.fStore[uVar7] = (uint)*(byte *)(lVar6 + 0x14);
  }
  piVar1 = (this->fSideOrient).super_TPZVec<int>.fStore;
  for (lVar6 = 0; lVar6 != 3; lVar6 = lVar6 + 1) {
    sideorient.super_TPZVec<int>.fStore[lVar6] = piVar1[lVar6];
  }
  if (this->fhdivfam == EHDivStandard) {
    TPZShapeHDiv<pzshape::TPZShapeTriang>::Initialize
              (&ids.super_TPZVec<long>,&orders.super_TPZVec<int>,&sideorient.super_TPZVec<int>,
               &data->super_TPZShapeData);
    uVar3 = TPZShapeHDiv<pzshape::TPZShapeTriang>::NShapeF(&data->super_TPZShapeData);
  }
  else {
    uVar3 = 0;
    if (this->fhdivfam == EHDivConstant) {
      TPZShapeHDivConstant<pzshape::TPZShapeTriang>::Initialize
                (&ids.super_TPZVec<long>,&orders.super_TPZVec<int>,&sideorient.super_TPZVec<int>,
                 &data->super_TPZShapeData);
      uVar3 = (**(code **)(*(long *)&(this->super_TPZIntelGen<pzshape::TPZShapeTriang>).
                                     super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                     super_TPZCompEl + 600))(this);
    }
  }
  TPZFMatrix<double>::Resize(&(data->phi).super_TPZFMatrix<double>,(long)(int)uVar3,1);
  TPZManVector<std::pair<int,_long>,_20>::Resize(&data->fVecShapeIndex,(long)(int)uVar3);
  row = 0;
  uVar7 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar7 = row;
  }
  lVar6 = 8;
  for (; uVar7 != row; row = row + 1) {
    pdVar5 = TPZFMatrix<double>::operator()(&(data->phi).super_TPZFMatrix<double>,row,0);
    *pdVar5 = 1.0;
    ppVar2 = (data->fVecShapeIndex).super_TPZVec<std::pair<int,_long>_>.fStore;
    *(int *)((long)ppVar2 + lVar6 + -8) = (int)row;
    *(ulong *)((long)&ppVar2->first + lVar6) = row;
    lVar6 = lVar6 + 0x10;
  }
  (data->super_TPZShapeData).fShapeType = EVecShape;
  TPZManVector<int,_3>::~TPZManVector(&sideorient);
  TPZManVector<int,_7>::~TPZManVector(&orders);
  TPZManVector<long,_3>::~TPZManVector(&ids);
  return;
}

Assistant:

void TPZCompElHDiv<TSHAPE>::InitMaterialData(TPZMaterialData &data)
{

    TPZManVector<int64_t,TSHAPE::NCornerNodes> ids(TSHAPE::NCornerNodes);
    TPZManVector<int,TSHAPE::NSides> orders(TSHAPE::NFacets+1,0);
    TPZManVector<int,TSHAPE::NFacets> sideorient(TSHAPE::NFacets,0);
    TPZGeoEl *gel = this->Reference();
    for(int i=0; i<TSHAPE::NCornerNodes; i++) ids[i] = gel->NodePtr(i)->Id();
    for(int i=0; i<TSHAPE::NFacets+1; i++) orders[i] = this->Connect(i).Order();
    for(int i=0; i<TSHAPE::NFacets; i++) sideorient[i] = this->SideOrient(i);
    TPZShapeData &shapedata = data;
    int nvec_shape = 0;

    switch (fhdivfam)
    {
    case HDivFamily::EHDivStandard:
        TPZShapeHDiv<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = TPZShapeHDiv<TSHAPE>::NShapeF(shapedata);
        break;
    case HDivFamily::EHDivConstant:
        TPZShapeHDivConstant<TSHAPE>::Initialize(ids, orders, sideorient, data);
        nvec_shape = this->NShapeF();
        break;
    
    default:
        break;
    }

//    int nshapescalar = shapedata.fPhi.Rows();
//    data.dphi.Resize(TSHAPE::Dimension, nshapescalar);
//    data.dphix.Resize(TSHAPE::Dimension, nshapescalar);
    // Trick to make actual hdiv materials work.
    // phi are all = 1. VecShapeIndex is 1 to 1 with its size the number of vec shapes
    
    data.phi.Resize(nvec_shape,1);
    data.fVecShapeIndex.Resize(nvec_shape);
    for (int ish = 0; ish<nvec_shape; ish++) {
        data.phi(ish,0) = 1.;
        data.fVecShapeIndex[ish] = {ish,ish};
    }
    
#ifdef PZ_LOG
        if(logger.isDebugEnabled())
		{
				LOGPZ_DEBUG(logger,"Initializing MaterialData of TPZCompElHDiv")
		}
#endif

    data.fShapeType = TPZMaterialData::EVecShape;

#ifdef PZ_LOG
    if(logger.isDebugEnabled())
	{
		std::stringstream sout;
		data.fDeformedDirections.Print("Normal vector ", sout,EMathematicaInput);
        for (int i=0; i<TSHAPE::NCornerNodes; i++) {
            sout << "Id[" << i << "] = " << this->Reference()->NodePtr(i)->Id() << " ";
        }

        sout << std::endl;
		sout << "NormalVector/Shape indexes \n";
        for (int i=0; i<data.fVecShapeIndex.size(); i++) {
            sout << i << '|' << data.fVecShapeIndex[i] << " ";
        }
        sout << std::endl;
		LOGPZ_DEBUG(logger,sout.str())
	}
#endif

}